

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_2::InMemoryEnv::GetChildren
          (InMemoryEnv *this,string *dir,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *result)

{
  long lVar1;
  bool bVar2;
  reference ppVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_type sVar4;
  const_reference pvVar5;
  string *in_RCX;
  char *in_RDI;
  long in_FS_OFFSET;
  string *filename;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>
  *kvp;
  FileSystem *__range2;
  iterator __end2;
  iterator __begin2;
  MutexLock lock;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff10;
  reference in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  reference in_stack_ffffffffffffff28;
  bool local_c1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MutexLock::MutexLock((MutexLock *)in_stack_ffffffffffffff08,(Mutex *)0x18d6644);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_ffffffffffffff08);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
  ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
           *)in_stack_ffffffffffffff10);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
  ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
         *)in_stack_ffffffffffffff10);
  while (bVar2 = std::operator==((_Self *)in_stack_ffffffffffffff18,
                                 (_Self *)in_stack_ffffffffffffff10), ((bVar2 ^ 0xffU) & 1) != 0) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>
             ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>
                          *)in_stack_ffffffffffffff08);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (in_stack_ffffffffffffff08);
    sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (in_stack_ffffffffffffff08);
    local_c1 = false;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(sVar4 + 1) <= this_00)
    {
      in_stack_ffffffffffffff28 = ppVar3;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                (in_stack_ffffffffffffff08);
      pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](&in_stack_ffffffffffffff18->first,(size_type)in_stack_ffffffffffffff10);
      local_c1 = false;
      if (*pvVar5 == '/') {
        Slice::Slice((Slice *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
        Slice::Slice((Slice *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
        in_stack_ffffffffffffff27 =
             Slice::starts_with((Slice *)in_stack_ffffffffffffff28,
                                (Slice *)CONCAT17(in_stack_ffffffffffffff27,
                                                  in_stack_ffffffffffffff20));
        local_c1 = (bool)in_stack_ffffffffffffff27;
      }
    }
    if (local_c1 != false) {
      in_stack_ffffffffffffff10 = in_RCX;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                (in_stack_ffffffffffffff08);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (this_00,(size_type)in_stack_ffffffffffffff28,
                 CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffff08,(value_type *)0x18d67d6);
      std::__cxx11::string::~string(in_stack_ffffffffffffff08);
      in_stack_ffffffffffffff18 = ppVar3;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>
                  *)in_stack_ffffffffffffff08);
  }
  Status::OK();
  MutexLock::~MutexLock((MutexLock *)in_stack_ffffffffffffff08);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (Status)in_RDI;
}

Assistant:

Status GetChildren(const std::string& dir,
                     std::vector<std::string>* result) override {
    MutexLock lock(&mutex_);
    result->clear();

    for (const auto& kvp : file_map_) {
      const std::string& filename = kvp.first;

      if (filename.size() >= dir.size() + 1 && filename[dir.size()] == '/' &&
          Slice(filename).starts_with(Slice(dir))) {
        result->push_back(filename.substr(dir.size() + 1));
      }
    }

    return Status::OK();
  }